

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_junit_xml_tests.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  UnitTestSource *pUVar5;
  Variable *pVVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionResult iutest_ar;
  iuCodeMessage local_550;
  ReturnTypedFixed<int> local_520;
  int argc_local;
  iuStreamMessage local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  argc_local = argc;
  iutest::detail::InitIrisUnitTest<char**>(&argc_local,argv);
  iutest::TestEnv::
  OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>::
  OptionString((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                *)&local_520);
  iutest::TestEnv::
  OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>::
  operator=((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
             *)&local_520,"junit:test.xml");
  std::__cxx11::string::~string((string *)&local_520);
  iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
  OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> *)
               &local_520);
  iutest::TestEnv::OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
  operator=((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter> *)
            &local_520,"-*Fail*");
  std::__cxx11::string::~string((string *)&local_520);
  pUVar5 = iutest::UnitTestSource::GetInstance();
  iVar3 = iutest::UnitTestSource::Run(pUVar5);
  iVar1 = 1;
  iVar7 = iVar1;
  if (iVar3 == 0) {
    pVVar6 = iutest::TestEnv::get_vars();
    iutest::internal::CmpHelperEQ<char[9],std::__cxx11::string>
              (&iutest_ar,(internal *)"\"test.xml\"",
               "(reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>( ::iutest::TestEnv::event_listeners().default_xml_generator() )->GetFilePath())"
               ,"test.xml",(char (*) [9])((pVVar6->m_event_listeners).m_default_xml_generator + 5),
               in_R9);
    bVar2 = iutest_ar.m_result;
    iVar3 = 0;
    if (iutest_ar.m_result == false) {
      memset(&local_388,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_388.m_stream);
      iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)&local_520,&local_388);
      local_520.ret.value = 1;
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_550,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                 ,0x8c,iutest_ar.m_message._M_dataplus._M_p);
      local_550._44_4_ = 2;
      iVar3 = iutest::AssertionHelper::operator=((AssertionHelper *)&local_550,&local_520);
      std::__cxx11::string::~string((string *)&local_550);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_520);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_388.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    iVar7 = iVar3;
    if (bVar2 != false) {
      local_520.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
           std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x13150b);
      iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (&iutest_ar,(internal *)"::std::string::npos","FileIO::s_io.find(\"Fail\")",
                 (char *)&std::__cxx11::string::npos,(unsigned_long *)&local_520,
                 (unsigned_long *)in_R9);
      bVar2 = iutest_ar.m_result;
      if (iutest_ar.m_result == false) {
        memset(&local_388,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_388.m_stream);
        std::__cxx11::string::string((string *)&local_40,(string *)&FileIO::s_io_abi_cxx11_);
        iutest::detail::iuStreamMessage::operator<<(&local_388,&local_40);
        iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)&local_520,&local_388);
        local_520.ret.value = 1;
        iutest::detail::iuCodeMessage::iuCodeMessage
                  (&local_550,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                   ,0x8d,iutest_ar.m_message._M_dataplus._M_p);
        local_550._44_4_ = 2;
        iVar3 = iutest::AssertionHelper::operator=((AssertionHelper *)&local_550,&local_520);
        std::__cxx11::string::~string((string *)&local_550);
        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                  ((iu_global_format_stringstream *)&local_520);
        std::__cxx11::string::~string((string *)&local_40);
        iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_388.m_stream);
      }
      std::__cxx11::string::~string((string *)&iutest_ar);
      iVar7 = iVar3;
      if (bVar2 != false) {
        local_520.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
             std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x131534);
        iutest::internal::CmpHelperNE<unsigned_long,unsigned_long>
                  (&iutest_ar,(internal *)"::std::string::npos","FileIO::s_io.find(\"Foo\" )",
                   (char *)&std::__cxx11::string::npos,(unsigned_long *)&local_520,
                   (unsigned_long *)in_R9);
        bVar2 = iutest_ar.m_result;
        if (iutest_ar.m_result == false) {
          memset(&local_388,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_388.m_stream);
          std::__cxx11::string::string((string *)&local_60,(string *)&FileIO::s_io_abi_cxx11_);
          iutest::detail::iuStreamMessage::operator<<(&local_388,&local_60);
          iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)&local_520,&local_388)
          ;
          local_520.ret.value = 1;
          iutest::detail::iuCodeMessage::iuCodeMessage
                    (&local_550,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                     ,0x8f,iutest_ar.m_message._M_dataplus._M_p);
          local_550._44_4_ = 2;
          iVar3 = iutest::AssertionHelper::operator=((AssertionHelper *)&local_550,&local_520);
          std::__cxx11::string::~string((string *)&local_550);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&local_520);
          std::__cxx11::string::~string((string *)&local_60);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_388.m_stream)
          ;
        }
        std::__cxx11::string::~string((string *)&iutest_ar);
        iVar7 = iVar3;
        if (bVar2 != false) {
          local_520.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
               std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x1312b9);
          iutest::internal::CmpHelperNE<unsigned_long,unsigned_long>
                    (&iutest_ar,(internal *)"::std::string::npos",
                     "FileIO::s_io.find(\"<skipped type=\\\"iutest.skip\\\"\" )",
                     (char *)&std::__cxx11::string::npos,(unsigned_long *)&local_520,
                     (unsigned_long *)in_R9);
          bVar2 = iutest_ar.m_result;
          if (iutest_ar.m_result == false) {
            memset(&local_388,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      (&local_388.m_stream);
            std::__cxx11::string::string((string *)&local_80,(string *)&FileIO::s_io_abi_cxx11_);
            iutest::detail::iuStreamMessage::operator<<(&local_388,&local_80);
            iutest::detail::iuStreamMessage::iuStreamMessage
                      ((iuStreamMessage *)&local_520,&local_388);
            local_520.ret.value = 1;
            iutest::detail::iuCodeMessage::iuCodeMessage
                      (&local_550,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                       ,0x91,iutest_ar.m_message._M_dataplus._M_p);
            local_550._44_4_ = 2;
            iVar3 = iutest::AssertionHelper::operator=((AssertionHelper *)&local_550,&local_520);
            std::__cxx11::string::~string((string *)&local_550);
            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                      ((iu_global_format_stringstream *)&local_520);
            std::__cxx11::string::~string((string *)&local_80);
            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                      (&local_388.m_stream);
          }
          std::__cxx11::string::~string((string *)&iutest_ar);
          iVar7 = iVar3;
          if (bVar2 != false) {
            local_520.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
                 std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x1312f9);
            iutest::internal::CmpHelperNE<unsigned_long,unsigned_long>
                      (&iutest_ar,(internal *)"::std::string::npos",
                       "FileIO::s_io.find(\"disabled test\" )",(char *)&std::__cxx11::string::npos,
                       (unsigned_long *)&local_520,(unsigned_long *)in_R9);
            bVar2 = iutest_ar.m_result;
            if (iutest_ar.m_result == false) {
              memset(&local_388,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        (&local_388.m_stream);
              std::__cxx11::string::string((string *)&local_a0,(string *)&FileIO::s_io_abi_cxx11_);
              iutest::detail::iuStreamMessage::operator<<(&local_388,&local_a0);
              iutest::detail::iuStreamMessage::iuStreamMessage
                        ((iuStreamMessage *)&local_520,&local_388);
              local_520.ret.value = 1;
              iutest::detail::iuCodeMessage::iuCodeMessage
                        (&local_550,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                         ,0x93,iutest_ar.m_message._M_dataplus._M_p);
              local_550._44_4_ = 2;
              iVar3 = iutest::AssertionHelper::operator=((AssertionHelper *)&local_550,&local_520);
              std::__cxx11::string::~string((string *)&local_550);
              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&local_520);
              std::__cxx11::string::~string((string *)&local_a0);
              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                        (&local_388.m_stream);
            }
            std::__cxx11::string::~string((string *)&iutest_ar);
            iVar7 = iVar3;
            if (bVar2 != false) {
              local_520.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
                   std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x131344);
              iutest::internal::CmpHelperNE<unsigned_long,unsigned_long>
                        (&iutest_ar,(internal *)"::std::string::npos",
                         "FileIO::s_io.find(\"<property name=\\\"fixture\\\" value=\\\"1\\\"\" )",
                         (char *)&std::__cxx11::string::npos,(unsigned_long *)&local_520,
                         (unsigned_long *)in_R9);
              bVar2 = iutest_ar.m_result;
              if (iutest_ar.m_result == false) {
                memset(&local_388,0,0x188);
                iutest::iu_global_format_stringstream::iu_global_format_stringstream
                          (&local_388.m_stream);
                std::__cxx11::string::string((string *)&local_c0,(string *)&FileIO::s_io_abi_cxx11_)
                ;
                iutest::detail::iuStreamMessage::operator<<(&local_388,&local_c0);
                iutest::detail::iuStreamMessage::iuStreamMessage
                          ((iuStreamMessage *)&local_520,&local_388);
                local_520.ret.value = 1;
                iutest::detail::iuCodeMessage::iuCodeMessage
                          (&local_550,
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                           ,0x96,iutest_ar.m_message._M_dataplus._M_p);
                local_550._44_4_ = 2;
                iVar3 = iutest::AssertionHelper::operator=((AssertionHelper *)&local_550,&local_520)
                ;
                std::__cxx11::string::~string((string *)&local_550);
                iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                          ((iu_global_format_stringstream *)&local_520);
                std::__cxx11::string::~string((string *)&local_c0);
                iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                          (&local_388.m_stream);
              }
              std::__cxx11::string::~string((string *)&iutest_ar);
              iVar7 = iVar3;
              if (bVar2 != false) {
                local_520.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
                     std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x1313a2);
                iutest::internal::CmpHelperNE<unsigned_long,unsigned_long>
                          (&iutest_ar,(internal *)"::std::string::npos",
                           "FileIO::s_io.find(\"<property name=\\\"type_param\\\" value=\" )",
                           (char *)&std::__cxx11::string::npos,(unsigned_long *)&local_520,
                           (unsigned_long *)in_R9);
                bVar2 = iutest_ar.m_result;
                if (iutest_ar.m_result == false) {
                  memset(&local_388,0,0x188);
                  iutest::iu_global_format_stringstream::iu_global_format_stringstream
                            (&local_388.m_stream);
                  std::__cxx11::string::string
                            ((string *)&local_e0,(string *)&FileIO::s_io_abi_cxx11_);
                  iutest::detail::iuStreamMessage::operator<<(&local_388,&local_e0);
                  iutest::detail::iuStreamMessage::iuStreamMessage
                            ((iuStreamMessage *)&local_520,&local_388);
                  local_520.ret.value = 1;
                  iutest::detail::iuCodeMessage::iuCodeMessage
                            (&local_550,
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                             ,0x99,iutest_ar.m_message._M_dataplus._M_p);
                  local_550._44_4_ = 2;
                  iVar3 = iutest::AssertionHelper::operator=
                                    ((AssertionHelper *)&local_550,&local_520);
                  std::__cxx11::string::~string((string *)&local_550);
                  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                            ((iu_global_format_stringstream *)&local_520);
                  std::__cxx11::string::~string((string *)&local_e0);
                  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                            (&local_388.m_stream);
                }
                std::__cxx11::string::~string((string *)&iutest_ar);
                iVar7 = iVar3;
                if (bVar2 != false) {
                  local_520.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
                       std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x131401);
                  iutest::internal::CmpHelperNE<unsigned_long,unsigned_long>
                            (&iutest_ar,(internal *)"::std::string::npos",
                             "FileIO::s_io.find(\"<property name=\\\"Test/0\\\" value=\\\"0\\\"\" )"
                             ,(char *)&std::__cxx11::string::npos,(unsigned_long *)&local_520,
                             (unsigned_long *)in_R9);
                  bVar2 = iutest_ar.m_result;
                  if (iutest_ar.m_result == false) {
                    memset(&local_388,0,0x188);
                    iutest::iu_global_format_stringstream::iu_global_format_stringstream
                              (&local_388.m_stream);
                    std::__cxx11::string::string
                              ((string *)&local_100,(string *)&FileIO::s_io_abi_cxx11_);
                    iutest::detail::iuStreamMessage::operator<<(&local_388,&local_100);
                    iutest::detail::iuStreamMessage::iuStreamMessage
                              ((iuStreamMessage *)&local_520,&local_388);
                    local_520.ret.value = 1;
                    iutest::detail::iuCodeMessage::iuCodeMessage
                              (&local_550,
                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                               ,0x9d,iutest_ar.m_message._M_dataplus._M_p);
                    local_550._44_4_ = 2;
                    iVar3 = iutest::AssertionHelper::operator=
                                      ((AssertionHelper *)&local_550,&local_520);
                    std::__cxx11::string::~string((string *)&local_550);
                    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                              ((iu_global_format_stringstream *)&local_520);
                    std::__cxx11::string::~string((string *)&local_100);
                    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                              (&local_388.m_stream);
                  }
                  std::__cxx11::string::~string((string *)&iutest_ar);
                  iVar7 = iVar3;
                  if (bVar2 != false) {
                    local_520.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
                         std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x131460);
                    iutest::internal::CmpHelperNE<unsigned_long,unsigned_long>
                              (&iutest_ar,(internal *)"::std::string::npos",
                               "FileIO::s_io.find(\"<property name=\\\"Test/1\\\" value=\\\"10\\\"\" )"
                               ,(char *)&std::__cxx11::string::npos,(unsigned_long *)&local_520,
                               (unsigned_long *)in_R9);
                    bVar2 = iutest_ar.m_result;
                    if (iutest_ar.m_result == false) {
                      memset(&local_388,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                (&local_388.m_stream);
                      std::__cxx11::string::string
                                ((string *)&local_120,(string *)&FileIO::s_io_abi_cxx11_);
                      iutest::detail::iuStreamMessage::operator<<(&local_388,&local_120);
                      iutest::detail::iuStreamMessage::iuStreamMessage
                                ((iuStreamMessage *)&local_520,&local_388);
                      local_520.ret.value = 1;
                      iutest::detail::iuCodeMessage::iuCodeMessage
                                (&local_550,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                 ,0x9f,iutest_ar.m_message._M_dataplus._M_p);
                      local_550._44_4_ = 2;
                      iVar3 = iutest::AssertionHelper::operator=
                                        ((AssertionHelper *)&local_550,&local_520);
                      std::__cxx11::string::~string((string *)&local_550);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                ((iu_global_format_stringstream *)&local_520);
                      std::__cxx11::string::~string((string *)&local_120);
                      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                (&local_388.m_stream);
                    }
                    std::__cxx11::string::~string((string *)&iutest_ar);
                    iVar7 = iVar3;
                    if (bVar2 != false) {
                      FileIO::s_io_abi_cxx11_._M_string_length = 0;
                      *FileIO::s_io_abi_cxx11_._M_dataplus._M_p = '\0';
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                      ::OptionString((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                                      *)&local_520);
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                      ::operator=((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                                   *)&local_520,"junit");
                      std::__cxx11::string::~string((string *)&local_520);
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                      ::OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                                      *)&local_520);
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                      ::operator=((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                                   *)&local_520,"*Fail*");
                      std::__cxx11::string::~string((string *)&local_520);
                      pUVar5 = iutest::UnitTestSource::GetInstance();
                      iVar4 = iutest::UnitTestSource::Run(pUVar5);
                      iVar7 = iVar1;
                      if (iVar4 != 0) {
                        pVVar6 = iutest::TestEnv::get_vars();
                        iutest::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
                                  (&iutest_ar,
                                   (internal *)
                                   "::iutest::detail::kStrings::DefaultXmlReportFileName",
                                   "(reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>( ::iutest::TestEnv::event_listeners().default_xml_generator() )->GetFilePath())"
                                   ,(char *)&iutest::detail::kStrings::DefaultXmlReportFileName,
                                   (char **)((pVVar6->m_event_listeners).m_default_xml_generator + 5
                                            ),in_R9);
                        bVar2 = iutest_ar.m_result;
                        if (iutest_ar.m_result == false) {
                          memset(&local_388,0,0x188);
                          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                    (&local_388.m_stream);
                          iutest::detail::iuStreamMessage::iuStreamMessage
                                    ((iuStreamMessage *)&local_520,&local_388);
                          local_520.ret.value = 1;
                          iutest::detail::iuCodeMessage::iuCodeMessage
                                    (&local_550,
                                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                     ,0xb0,iutest_ar.m_message._M_dataplus._M_p);
                          local_550._44_4_ = 2;
                          iVar3 = iutest::AssertionHelper::operator=
                                            ((AssertionHelper *)&local_550,&local_520);
                          std::__cxx11::string::~string((string *)&local_550);
                          iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                    ((iu_global_format_stringstream *)&local_520);
                          iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                    (&local_388.m_stream);
                        }
                        std::__cxx11::string::~string((string *)&iutest_ar);
                        iVar7 = iVar3;
                        if (bVar2 != false) {
                          local_520.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
                               std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x13150b)
                          ;
                          iutest::internal::CmpHelperNE<unsigned_long,unsigned_long>
                                    (&iutest_ar,(internal *)"::std::string::npos",
                                     "FileIO::s_io.find(\"Fail\")",
                                     (char *)&std::__cxx11::string::npos,(unsigned_long *)&local_520
                                     ,(unsigned_long *)in_R9);
                          bVar2 = iutest_ar.m_result;
                          if (iutest_ar.m_result == false) {
                            memset(&local_388,0,0x188);
                            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                      (&local_388.m_stream);
                            std::__cxx11::string::string
                                      ((string *)&local_140,(string *)&FileIO::s_io_abi_cxx11_);
                            iutest::detail::iuStreamMessage::operator<<(&local_388,&local_140);
                            iutest::detail::iuStreamMessage::iuStreamMessage
                                      ((iuStreamMessage *)&local_520,&local_388);
                            local_520.ret.value = 1;
                            iutest::detail::iuCodeMessage::iuCodeMessage
                                      (&local_550,
                                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                       ,0xb1,iutest_ar.m_message._M_dataplus._M_p);
                            local_550._44_4_ = 2;
                            iVar3 = iutest::AssertionHelper::operator=
                                              ((AssertionHelper *)&local_550,&local_520);
                            std::__cxx11::string::~string((string *)&local_550);
                            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                      ((iu_global_format_stringstream *)&local_520);
                            std::__cxx11::string::~string((string *)&local_140);
                            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                      (&local_388.m_stream);
                          }
                          std::__cxx11::string::~string((string *)&iutest_ar);
                          iVar7 = iVar3;
                          if (bVar2 != false) {
                            local_520.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
                                 std::__cxx11::string::find
                                           ((char *)&FileIO::s_io_abi_cxx11_,0x131534);
                            iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                                      (&iutest_ar,(internal *)"::std::string::npos",
                                       "FileIO::s_io.find(\"Foo\" )",
                                       (char *)&std::__cxx11::string::npos,
                                       (unsigned_long *)&local_520,(unsigned_long *)in_R9);
                            bVar2 = iutest_ar.m_result;
                            if (iutest_ar.m_result == false) {
                              memset(&local_388,0,0x188);
                              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                        (&local_388.m_stream);
                              std::__cxx11::string::string
                                        ((string *)&local_160,(string *)&FileIO::s_io_abi_cxx11_);
                              iutest::detail::iuStreamMessage::operator<<(&local_388,&local_160);
                              iutest::detail::iuStreamMessage::iuStreamMessage
                                        ((iuStreamMessage *)&local_520,&local_388);
                              local_520.ret.value = 1;
                              iutest::detail::iuCodeMessage::iuCodeMessage
                                        (&local_550,
                                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                         ,0xb3,iutest_ar.m_message._M_dataplus._M_p);
                              local_550._44_4_ = 2;
                              iVar3 = iutest::AssertionHelper::operator=
                                                ((AssertionHelper *)&local_550,&local_520);
                              std::__cxx11::string::~string((string *)&local_550);
                              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                        ((iu_global_format_stringstream *)&local_520);
                              std::__cxx11::string::~string((string *)&local_160);
                              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                                        (&local_388.m_stream);
                            }
                            std::__cxx11::string::~string((string *)&iutest_ar);
                            iVar7 = iVar3;
                            if (bVar2 != false) {
                              FileIO::s_io_abi_cxx11_._M_string_length = 0;
                              *FileIO::s_io_abi_cxx11_._M_dataplus._M_p = '\0';
                              iutest::TestEnv::
                              OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                              ::OptionString((OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                                              *)&local_520);
                              iutest::TestEnv::
                              OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                              ::operator=((OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                                           *)&local_520,"root");
                              std::__cxx11::string::~string((string *)&local_520);
                              iutest::TestEnv::
                              OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                              ::OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                                              *)&local_520);
                              iutest::TestEnv::
                              OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                              ::operator=((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                                           *)&local_520,(char *)0x0);
                              std::__cxx11::string::~string((string *)&local_520);
                              pUVar5 = iutest::UnitTestSource::GetInstance();
                              iVar4 = iutest::UnitTestSource::Run(pUVar5);
                              iVar7 = iVar1;
                              if (iVar4 != 0) {
                                pVVar6 = iutest::TestEnv::get_vars();
                                iutest::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
                                          (&iutest_ar,
                                           (internal *)
                                           "::iutest::detail::kStrings::DefaultXmlReportFileName",
                                           "(reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>( ::iutest::TestEnv::event_listeners().default_xml_generator() )->GetFilePath())"
                                           ,(char *)&iutest::detail::kStrings::
                                                     DefaultXmlReportFileName,
                                           (char **)((pVVar6->m_event_listeners).
                                                     m_default_xml_generator + 5),in_R9);
                                bVar2 = iutest_ar.m_result;
                                if (iutest_ar.m_result == false) {
                                  memset(&local_388,0,0x188);
                                  iutest::iu_global_format_stringstream::
                                  iu_global_format_stringstream(&local_388.m_stream);
                                  iutest::detail::iuStreamMessage::iuStreamMessage
                                            ((iuStreamMessage *)&local_520,&local_388);
                                  local_520.ret.value = 1;
                                  iutest::detail::iuCodeMessage::iuCodeMessage
                                            (&local_550,
                                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                             ,0xc1,iutest_ar.m_message._M_dataplus._M_p);
                                  local_550._44_4_ = 2;
                                  iVar3 = iutest::AssertionHelper::operator=
                                                    ((AssertionHelper *)&local_550,&local_520);
                                  std::__cxx11::string::~string((string *)&local_550);
                                  iutest::iu_global_format_stringstream::
                                  ~iu_global_format_stringstream
                                            ((iu_global_format_stringstream *)&local_520);
                                  iutest::iu_global_format_stringstream::
                                  ~iu_global_format_stringstream(&local_388.m_stream);
                                }
                                std::__cxx11::string::~string((string *)&iutest_ar);
                                iVar7 = iVar3;
                                if (bVar2 != false) {
                                  local_520.fixed.super_Message.m_stream.super_iu_stringstream._0_8_
                                       = std::__cxx11::string::find
                                                   ((char *)&FileIO::s_io_abi_cxx11_,0x1314dd);
                                  iutest::internal::CmpHelperNE<unsigned_long,unsigned_long>
                                            (&iutest_ar,(internal *)"::std::string::npos",
                                             "FileIO::s_io.find(\"root.Test\" )",
                                             (char *)&std::__cxx11::string::npos,
                                             (unsigned_long *)&local_520,(unsigned_long *)in_R9);
                                  bVar2 = iutest_ar.m_result;
                                  if (iutest_ar.m_result == false) {
                                    memset(&local_388,0,0x188);
                                    iutest::iu_global_format_stringstream::
                                    iu_global_format_stringstream(&local_388.m_stream);
                                    std::__cxx11::string::string
                                              ((string *)&local_180,
                                               (string *)&FileIO::s_io_abi_cxx11_);
                                    iutest::detail::iuStreamMessage::operator<<
                                              (&local_388,&local_180);
                                    iutest::detail::iuStreamMessage::iuStreamMessage
                                              ((iuStreamMessage *)&local_520,&local_388);
                                    local_520.ret.value = 1;
                                    iutest::detail::iuCodeMessage::iuCodeMessage
                                              (&local_550,
                                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                               ,0xc2,iutest_ar.m_message._M_dataplus._M_p);
                                    local_550._44_4_ = 2;
                                    iVar3 = iutest::AssertionHelper::operator=
                                                      ((AssertionHelper *)&local_550,&local_520);
                                    std::__cxx11::string::~string((string *)&local_550);
                                    iutest::iu_global_format_stringstream::
                                    ~iu_global_format_stringstream
                                              ((iu_global_format_stringstream *)&local_520);
                                    std::__cxx11::string::~string((string *)&local_180);
                                    iutest::iu_global_format_stringstream::
                                    ~iu_global_format_stringstream(&local_388.m_stream);
                                  }
                                  std::__cxx11::string::~string((string *)&iutest_ar);
                                  iVar7 = iVar3;
                                  if (bVar2 != false) {
                                    local_520.fixed.super_Message.m_stream.super_iu_stringstream.
                                    _0_8_ = std::__cxx11::string::find
                                                      ((char *)&FileIO::s_io_abi_cxx11_,0x131506);
                                    iutest::internal::CmpHelperNE<unsigned_long,unsigned_long>
                                              (&iutest_ar,(internal *)"::std::string::npos",
                                               "FileIO::s_io.find(\"root.Fail\")",
                                               (char *)&std::__cxx11::string::npos,
                                               (unsigned_long *)&local_520,(unsigned_long *)in_R9);
                                    bVar2 = iutest_ar.m_result;
                                    if (iutest_ar.m_result == false) {
                                      memset(&local_388,0,0x188);
                                      iutest::iu_global_format_stringstream::
                                      iu_global_format_stringstream(&local_388.m_stream);
                                      std::__cxx11::string::string
                                                ((string *)&local_1a0,
                                                 (string *)&FileIO::s_io_abi_cxx11_);
                                      iutest::detail::iuStreamMessage::operator<<
                                                (&local_388,&local_1a0);
                                      iutest::detail::iuStreamMessage::iuStreamMessage
                                                ((iuStreamMessage *)&local_520,&local_388);
                                      local_520.ret.value = 1;
                                      iutest::detail::iuCodeMessage::iuCodeMessage
                                                (&local_550,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                                 ,0xc4,iutest_ar.m_message._M_dataplus._M_p);
                                      local_550._44_4_ = 2;
                                      iVar3 = iutest::AssertionHelper::operator=
                                                        ((AssertionHelper *)&local_550,&local_520);
                                      std::__cxx11::string::~string((string *)&local_550);
                                      iutest::iu_global_format_stringstream::
                                      ~iu_global_format_stringstream
                                                ((iu_global_format_stringstream *)&local_520);
                                      std::__cxx11::string::~string((string *)&local_1a0);
                                      iutest::iu_global_format_stringstream::
                                      ~iu_global_format_stringstream(&local_388.m_stream);
                                    }
                                    std::__cxx11::string::~string((string *)&iutest_ar);
                                    iVar7 = iVar3;
                                    if (bVar2 != false) {
                                      local_520.fixed.super_Message.m_stream.super_iu_stringstream.
                                      _0_8_ = std::__cxx11::string::find
                                                        ((char *)&FileIO::s_io_abi_cxx11_,0x13152f);
                                      iutest::internal::CmpHelperNE<unsigned_long,unsigned_long>
                                                (&iutest_ar,(internal *)"::std::string::npos",
                                                 "FileIO::s_io.find(\"root.Foo\" )",
                                                 (char *)&std::__cxx11::string::npos,
                                                 (unsigned_long *)&local_520,(unsigned_long *)in_R9)
                                      ;
                                      bVar2 = iutest_ar.m_result;
                                      if (iutest_ar.m_result == false) {
                                        memset(&local_388,0,0x188);
                                        iutest::iu_global_format_stringstream::
                                        iu_global_format_stringstream(&local_388.m_stream);
                                        std::__cxx11::string::string
                                                  ((string *)&local_1c0,
                                                   (string *)&FileIO::s_io_abi_cxx11_);
                                        iutest::detail::iuStreamMessage::operator<<
                                                  (&local_388,&local_1c0);
                                        iutest::detail::iuStreamMessage::iuStreamMessage
                                                  ((iuStreamMessage *)&local_520,&local_388);
                                        local_520.ret.value = 1;
                                        iutest::detail::iuCodeMessage::iuCodeMessage
                                                  (&local_550,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                                  ,0xc6,iutest_ar.m_message._M_dataplus._M_p);
                                        local_550._44_4_ = 2;
                                        iVar3 = iutest::AssertionHelper::operator=
                                                          ((AssertionHelper *)&local_550,&local_520)
                                        ;
                                        std::__cxx11::string::~string((string *)&local_550);
                                        iutest::iu_global_format_stringstream::
                                        ~iu_global_format_stringstream
                                                  ((iu_global_format_stringstream *)&local_520);
                                        std::__cxx11::string::~string((string *)&local_1c0);
                                        iutest::iu_global_format_stringstream::
                                        ~iu_global_format_stringstream(&local_388.m_stream);
                                      }
                                      std::__cxx11::string::~string((string *)&iutest_ar);
                                      iVar7 = iVar3;
                                      if (bVar2 != false) {
                                        local_520.fixed.super_Message.m_stream.super_iu_stringstream
                                        ._0_8_ = std::__cxx11::string::find
                                                           ((char *)&FileIO::s_io_abi_cxx11_,
                                                            0x131557);
                                        iutest::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                                                  (&iutest_ar,(internal *)"::std::string::npos",
                                                   "FileIO::s_io.find(\"root.Bar\" )",
                                                   (char *)&std::__cxx11::string::npos,
                                                   (unsigned_long *)&local_520,
                                                   (unsigned_long *)in_R9);
                                        bVar2 = iutest_ar.m_result;
                                        if (iutest_ar.m_result == false) {
                                          memset(&local_388,0,0x188);
                                          iutest::iu_global_format_stringstream::
                                          iu_global_format_stringstream(&local_388.m_stream);
                                          std::__cxx11::string::string
                                                    ((string *)&local_1e0,
                                                     (string *)&FileIO::s_io_abi_cxx11_);
                                          iutest::detail::iuStreamMessage::operator<<
                                                    (&local_388,&local_1e0);
                                          iutest::detail::iuStreamMessage::iuStreamMessage
                                                    ((iuStreamMessage *)&local_520,&local_388);
                                          local_520.ret.value = 1;
                                          iutest::detail::iuCodeMessage::iuCodeMessage
                                                    (&local_550,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                                  ,200,iutest_ar.m_message._M_dataplus._M_p);
                                          local_550._44_4_ = 2;
                                          iVar3 = iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)&local_550,
                                                             &local_520);
                                          std::__cxx11::string::~string((string *)&local_550);
                                          iutest::iu_global_format_stringstream::
                                          ~iu_global_format_stringstream
                                                    ((iu_global_format_stringstream *)&local_520);
                                          std::__cxx11::string::~string((string *)&local_1e0);
                                          iutest::iu_global_format_stringstream::
                                          ~iu_global_format_stringstream(&local_388.m_stream);
                                        }
                                        std::__cxx11::string::~string((string *)&iutest_ar);
                                        iVar7 = iVar3;
                                        if (bVar2 != false) {
                                          local_520.fixed.super_Message.m_stream.
                                          super_iu_stringstream._0_8_ =
                                               std::__cxx11::string::find
                                                         ((char *)&FileIO::s_io_abi_cxx11_,0x13157f)
                                          ;
                                          iutest::internal::CmpHelperNE<unsigned_long,unsigned_long>
                                                    (&iutest_ar,(internal *)"::std::string::npos",
                                                     "FileIO::s_io.find(\"test.Foo\" )",
                                                     (char *)&std::__cxx11::string::npos,
                                                     (unsigned_long *)&local_520,
                                                     (unsigned_long *)in_R9);
                                          if (iutest_ar.m_result == false) {
                                            memset(&local_388,0,0x188);
                                            iutest::iu_global_format_stringstream::
                                            iu_global_format_stringstream(&local_388.m_stream);
                                            std::__cxx11::string::string
                                                      ((string *)&local_200,
                                                       (string *)&FileIO::s_io_abi_cxx11_);
                                            iutest::detail::iuStreamMessage::operator<<
                                                      (&local_388,&local_200);
                                            iutest::detail::iuStreamMessage::iuStreamMessage
                                                      ((iuStreamMessage *)&local_520,&local_388);
                                            local_520.ret.value = 1;
                                            iutest::detail::iuCodeMessage::iuCodeMessage
                                                      (&local_550,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
                                                  ,0xcb,iutest_ar.m_message._M_dataplus._M_p);
                                            local_550._44_4_ = 2;
                                            iVar3 = iutest::AssertionHelper::operator=
                                                              ((AssertionHelper *)&local_550,
                                                               &local_520);
                                            std::__cxx11::string::~string((string *)&local_550);
                                            iutest::iu_global_format_stringstream::
                                            ~iu_global_format_stringstream
                                                      ((iu_global_format_stringstream *)&local_520);
                                            std::__cxx11::string::~string((string *)&local_200);
                                            iutest::iu_global_format_stringstream::
                                            ~iu_global_format_stringstream(&local_388.m_stream);
                                          }
                                          std::__cxx11::string::~string((string *)&iutest_ar);
                                          iVar7 = iVar3;
                                          if (iutest_ar.m_result != false) {
                                            FileIO::s_io_abi_cxx11_._M_string_length = 0;
                                            *FileIO::s_io_abi_cxx11_._M_dataplus._M_p = '\0';
                                            puts("*** Successful ***");
                                            iVar7 = 0;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
#if OUTPUT_JUNIT_XML_TEST
    IUTEST_INIT(&argc, argv);

    ::iutest::IUTEST_FLAG(output) = "junit:test.xml";

    {
        ::iutest::IUTEST_FLAG(filter) = "-*Fail*";
        const int ret = IUTEST_RUN_ALL_TESTS();
        if( ret != 0 ) return 1;

        IUTEST_ASSERT_EQ( "test.xml"
            , (reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>(
                ::iutest::TestEnv::event_listeners().default_xml_generator()
                )->GetFilePath()) ) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_EQ(::std::string::npos, FileIO::s_io.find("Fail"))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("Foo" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("<skipped type=\"iutest.skip\"" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("disabled test" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#if !defined(IUTEST_NO_ARGUMENT_DEPENDENT_LOOKUP)
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("<property name=\"fixture\" value=\"1\"" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#if IUTEST_HAS_TYPED_TEST
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("<property name=\"type_param\" value=" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#endif
#if IUTEST_HAS_PARAM_TEST
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("<property name=\"Test/0\" value=\"0\""  ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("<property name=\"Test/1\" value=\"10\"" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#endif
#endif

        FileIO::s_io.clear();
    }

    ::iutest::IUTEST_FLAG(output) = "junit";
    {
        ::iutest::IUTEST_FLAG(filter) = "*Fail*";
        const int ret = IUTEST_RUN_ALL_TESTS();

        if( ret == 0 ) return 1;
        IUTEST_ASSERT_EQ( ::iutest::detail::kStrings::DefaultXmlReportFileName
            , (reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>(
                ::iutest::TestEnv::event_listeners().default_xml_generator()
                )->GetFilePath()) ) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("Fail"))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_EQ(::std::string::npos, FileIO::s_io.find("Foo" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);

        FileIO::s_io.clear();
    }
    {
        ::iutest::IUTEST_FLAG(default_package_name) = "root";
        ::iutest::IUTEST_FLAG(filter) = NULL;
        const int ret = IUTEST_RUN_ALL_TESTS();

        if( ret == 0 ) return 1;
        IUTEST_ASSERT_EQ( ::iutest::detail::kStrings::DefaultXmlReportFileName
            , (reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>(
                ::iutest::TestEnv::event_listeners().default_xml_generator()
                )->GetFilePath()) ) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("root.Test" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("root.Fail"))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("root.Foo" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_EQ(::std::string::npos, FileIO::s_io.find("root.Bar" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#if IUTEST_HAS_PACKAGE
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find("test.Foo" ))
            << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
#endif

        FileIO::s_io.clear();
    }
    printf("*** Successful ***\n");
#else
    (void)argc;
    (void)argv;
    printf("*** OUTPUT_JUNIT_XML_TEST=0 ***\n");
#endif
    return 0;
}